

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O1

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>::
tbbRadixIteration1(ParallelRadixSort<embree::parallel_map<unsigned_long,_float>::KeyValue,_unsigned_long>
                   *this,unsigned_long shift,KeyValue *src,KeyValue *dst,size_t threadIndex,
                  size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  TyRadixCount *pauVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  uint offset [256];
  uint total [256];
  uint local_880 [256];
  uint local_480 [276];
  
  sVar2 = this->N;
  lVar10 = 0;
  memset(local_880 + 0x100,0,0x400);
  uVar5 = (sVar2 * threadIndex) / threadCount;
  pauVar6 = this->radixCount;
  do {
    uVar8 = 0xfffffffffffffffc;
    do {
      puVar1 = *pauVar6 + uVar8 + 4;
      uVar7 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      local_880[uVar8 + 0x104] = *puVar1 + local_880[uVar8 + 0x104];
      local_880[uVar8 + 0x105] = uVar7 + local_880[uVar8 + 0x105];
      local_880[uVar8 + 0x106] = uVar3 + local_880[uVar8 + 0x106];
      local_880[uVar8 + 0x107] = uVar4 + local_880[uVar8 + 0x107];
      uVar8 = uVar8 + 4;
    } while (uVar8 < 0xfc);
    lVar10 = lVar10 + 1;
    pauVar6 = pauVar6 + 1;
  } while (lVar10 != threadCount + (threadCount == 0));
  local_880[0] = 0;
  lVar10 = 1;
  uVar7 = 0;
  do {
    uVar7 = uVar7 + local_880[lVar10 + 0xff];
    local_880[lVar10] = uVar7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x100);
  if (threadIndex != 0) {
    pauVar6 = this->radixCount;
    sVar9 = 0;
    do {
      uVar8 = 0xfffffffffffffffc;
      do {
        puVar1 = *pauVar6 + uVar8 + 4;
        uVar7 = puVar1[1];
        uVar3 = puVar1[2];
        uVar4 = puVar1[3];
        local_880[uVar8 + 4] = *puVar1 + local_880[uVar8 + 4];
        local_880[uVar8 + 5] = uVar7 + local_880[uVar8 + 5];
        local_880[uVar8 + 6] = uVar3 + local_880[uVar8 + 6];
        local_880[uVar8 + 7] = uVar4 + local_880[uVar8 + 7];
        uVar8 = uVar8 + 4;
      } while (uVar8 < 0xfc);
      sVar9 = sVar9 + 1;
      pauVar6 = pauVar6 + 1;
    } while (sVar9 != threadIndex);
  }
  for (; uVar5 < ((threadIndex + 1) * sVar2) / threadCount; uVar5 = uVar5 + 1) {
    uVar8 = src[uVar5].key >> ((byte)shift & 0x3f) & 0xff;
    uVar7 = local_880[uVar8];
    local_880[uVar8] = uVar7 + 1;
    dst[uVar7].val = src[uVar5].val;
    dst[uVar7].key = src[uVar5].key;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }